

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parse_vrplib_depot_section(VrplibParser *p,Instance *instance)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  ulong in_RAX;
  char *string;
  char *fmt;
  int32_t nodeid;
  undefined8 uStack_38;
  
  bVar2 = true;
  uStack_38 = in_RAX;
  do {
    string = get_token_lexeme(p);
    if (string == (char *)0x0) {
      _Var3 = false;
    }
    else {
      uStack_38 = uStack_38 & 0xffffffff;
      _Var3 = str_to_int32(string,(int32_t *)((long)&uStack_38 + 4));
      if (_Var3) {
        _Var3 = true;
        if (bVar2) {
          if (uStack_38._4_4_ != 1) {
            fmt = "Expected single depot with index `1`. Got `%d` instead";
LAB_00104030:
            _Var3 = false;
            parse_error(p,fmt);
          }
        }
        else if (uStack_38._4_4_ != -1) {
          fmt = "Expected value `-1` marking the end of the depot section, Found `%d` instead";
          goto LAB_00104030;
        }
      }
      else {
        _Var3 = false;
        parse_error(p,"Expected valid integer for DEPOT_SECTION");
      }
      free(string);
    }
    _Var4 = parser_match_newline(p);
    if (!_Var4) {
      parse_error(p,"Expected newline");
      return false;
    }
    bVar1 = _Var3 & bVar2;
    bVar2 = false;
    if (bVar1 == 0) {
      return _Var3;
    }
  } while( true );
}

Assistant:

static bool parse_vrplib_depot_section(VrplibParser *p, Instance *instance) {
    UNUSED_PARAM(instance);
    bool result = true;
    for (int32_t i = 0; result && (i <= 1); i++) {
        char *lexeme = get_token_lexeme(p);
        if (!lexeme) {
            result = false;
        } else {
            int32_t nodeid = 0;
            if (!str_to_int32(lexeme, &nodeid)) {
                parse_error(p, "Expected valid integer for DEPOT_SECTION");
                result = false;
            } else {
                if (i == 0) {
                    if (nodeid != 1) {
                        parse_error(p,
                                    "Expected single depot with index `1`. Got "
                                    "`%d` instead",
                                    nodeid);
                        result = false;
                    }
                } else {
                    if (nodeid != -1) {
                        parse_error(p,
                                    "Expected value `-1` marking the end of "
                                    "the depot section, Found `%d` instead",
                                    nodeid);
                        result = false;
                    }
                }
            }
        }

        if (lexeme) {
            free(lexeme);
        }

        if (!parser_match_newline(p)) {
            parse_error(p, "Expected newline");
            result = false;
        }
    }

    return result;
}